

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O3

Macros * __thiscall pstack::Dwarf::Unit::getMacros(Unit *this)

{
  unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_> *this_00;
  AttrName name;
  Info *dwarf;
  intmax_t offset;
  _Head_base<0UL,_pstack::Dwarf::Macros_*,_false> this_01;
  long lVar1;
  _Head_base<0UL,_pstack::Dwarf::Macros_*,_false> _Var2;
  DIE local_a0;
  undefined1 local_78 [8];
  Attribute a;
  
  _Var2._M_head_impl =
       (this->macros)._M_t.
       super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>.
       _M_t.
       super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>.
       super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (Macros *)0x0) {
    this_00 = &this->macros;
    root(&local_a0,this);
    stack0xffffffffffffffbc = 0x7900002119;
    lVar1 = 0;
    do {
      name = *(AttrName *)((long)&a.formp + lVar1 + 4);
      DIE::attribute((Attribute *)local_78,&local_a0,name,false);
      if (a.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        dwarf = this->dwarf;
        offset = DIE::Attribute::operator_cast_to_long((Attribute *)local_78);
        this_01._M_head_impl = (Macros *)operator_new(0x50);
        Macros::Macros(this_01._M_head_impl,dwarf,offset,name == DW_AT_macro_info ^ 5);
        _Var2._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
             .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>.
        _M_t.
        super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
        .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl = this_01._M_head_impl;
        if (_Var2._M_head_impl != (Macros *)0x0) {
          std::default_delete<pstack::Dwarf::Macros>::operator()
                    ((default_delete<pstack::Dwarf::Macros> *)this_00,_Var2._M_head_impl);
          this_01._M_head_impl =
               (this_00->_M_t).
               super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
               .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
        }
        DIE::~DIE((DIE *)local_78);
        DIE::~DIE(&local_a0);
        return this_01._M_head_impl;
      }
      DIE::~DIE((DIE *)local_78);
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0xc);
    DIE::~DIE(&local_a0);
    _Var2._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>.
         _M_t.
         super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
         .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
  }
  return _Var2._M_head_impl;
}

Assistant:

const Macros *
Unit::getMacros()
{
    if (macros == nullptr) {
       const DIE &root_ = root();
       for (auto i : { DW_AT_GNU_macros, DW_AT_macros, DW_AT_macro_info }) {
          auto a = root_.attribute(i);
          if (a.valid()) {
              macros = std::make_unique<Macros>(*dwarf, intmax_t(a), i == DW_AT_macro_info ? 4 : 5);
              return macros.get();
          }
       }
    }
    return macros.get();
}